

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O2

bool __thiscall
(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer::
handleChild(wasm::Expression*&,wasm::Expression__unsigned_int_
          (void *this,Expression **child,Expression *parent,Index fieldIndex)

{
  ulong uVar1;
  size_t *psVar2;
  size_t sVar3;
  Module *module;
  unique_ptr *puVar4;
  char *pcVar5;
  size_t sVar6;
  bool bVar7;
  size_type sVar8;
  Block *pBVar9;
  long lVar10;
  GlobalGet *ref;
  StructSet *item;
  Const *index;
  HeapType HVar11;
  Expression *pEVar12;
  ulong uVar13;
  Name NVar14;
  Name name;
  optional<wasm::Type> type;
  IString IVar15;
  string_view local_b8;
  size_t local_a8;
  char *pcStack_a0;
  Type local_98;
  Builder local_90;
  Builder builder;
  _Vector_base<wasm::Type,_std::allocator<wasm::Type>_> local_58;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_40;
  ulong local_38;
  
  pEVar12 = *child;
  if (((pEVar12 == (Expression *)0x0) || (pEVar12->_id != GlobalGetId)) ||
     (sVar8 = std::
              _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::count(*(_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        **)((long)this + 0xe8),(key_type *)(pEVar12 + 1)), sVar8 != 0)) {
    bVar7 = false;
  }
  else {
    bVar7 = anon_unknown.dwarf_5fce8::isNullableAndMutable(parent,fieldIndex);
    if (!bVar7) {
      __assert_fail("isNullableAndMutable(parent, fieldIndex)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-ctor-eval.cpp"
                    ,0x2ec,
                    "bool (anonymous namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer::handleChild(Expression *&, Expression *, Index)"
                   );
    }
    uVar1 = *(ulong *)((long)this + 0xd8);
    psVar2 = (size_t *)**(long **)((long)this + 0xe0);
    local_a8 = *psVar2;
    pcStack_a0 = (char *)psVar2[1];
    sVar3 = psVar2[7];
    local_98.id = sVar3;
    local_38 = uVar1;
    if (*(char *)(uVar1 + 0x108) == '\0') {
      local_90.wasm = *(Module **)(uVar1 + 8);
      uVar13 = uVar1;
      pBVar9 = MixedArena::alloc<wasm::Block>(&(local_90.wasm)->allocator);
      *(Block **)(uVar1 + 0x100) = pBVar9;
      *(undefined1 *)(uVar1 + 0x108) = 1;
      module = *(Module **)(uVar1 + 8);
      if ((module->start).super_IString.str._M_str == (char *)0x0) {
        wasm::Name::Name((Name *)&local_b8,"start");
        IVar15.str = (string_view)wasm::Names::getValidFunctionName(module,local_b8);
        ((IString *)(*(long *)(local_38 + 8) + 0xc0))->str = IVar15.str;
        puVar4 = *(unique_ptr **)(local_38 + 8);
        pcVar5 = *(char **)(puVar4 + 0xc0);
        HVar11.id = *(uintptr_t *)(puVar4 + 200);
        wasm::HeapType::HeapType((HeapType *)&builder,(Signature)ZEXT816(0));
        local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        name.super_IString.str._M_str = pcVar5;
        name.super_IString.str._M_len = (size_t)&local_40;
        wasm::Builder::makeFunction
                  (name,HVar11,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)builder.wasm,
                   (Expression *)&local_58);
        wasm::Module::addFunction(puVar4);
        std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
                  (&local_40);
        std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base(&local_58);
      }
      else {
        NVar14.super_IString.str._M_str = (char *)(module->start).super_IString.str._M_len;
        NVar14.super_IString.str._M_len = (size_t)module;
        lVar10 = wasm::Module::getFunction(NVar14);
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar13;
        pBVar9 = wasm::Builder::makeSequence
                           (&local_90,*(Expression **)(local_38 + 0x100),
                            *(Expression **)(lVar10 + 0x60),type);
        *(Block **)(lVar10 + 0x60) = pBVar9;
      }
    }
    pcVar5 = pcStack_a0;
    sVar6 = local_a8;
    local_58._M_impl.super__Vector_impl_data._M_start = *(pointer *)(local_38 + 8);
    ref = MixedArena::alloc<wasm::GlobalGet>
                    ((MixedArena *)(local_58._M_impl.super__Vector_impl_data._M_start + 0x40));
    (ref->name).super_IString.str._M_len = sVar6;
    (ref->name).super_IString.str._M_str = pcVar5;
    (ref->super_SpecificExpression<(wasm::Expression::Id)10>).super_Expression.type.id = sVar3;
    bVar7 = wasm::Type::isStruct(&local_98);
    if (bVar7) {
      item = wasm::Builder::makeStructSet
                       ((Builder *)&local_58,fieldIndex,(Expression *)ref,pEVar12,Unordered);
    }
    else {
      index = wasm::Builder::makeConst<int>((Builder *)&local_58,fieldIndex);
      item = (StructSet *)
             wasm::Builder::makeArraySet
                       ((Builder *)&local_58,(Expression *)ref,(Expression *)index,pEVar12);
    }
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
               (*(long *)(local_38 + 0x100) + 0x20),(Expression *)item);
    local_58._M_impl.super__Vector_impl_data._M_start = *(pointer *)((long)this + 0xd0);
    HVar11 = wasm::Type::getHeapType(&pEVar12->type);
    pEVar12 = (Expression *)wasm::Builder::makeRefNull((Builder *)&local_58,HVar11);
    *child = pEVar12;
    bVar7 = true;
  }
  return bVar7;
}

Assistant:

bool handleChild(Expression*& child,
                         Expression* parent,
                         Index fieldIndex = 0) {
          if (!child) {
            return false;
          }

          if (auto* get = child->dynCast<GlobalGet>()) {
            if (!readableGlobals.count(get->name)) {
              // This get cannot be read - it is a global that appears after
              // us - and so we must fix it up, using the method mentioned
              // before (setting it to null now, and later in the start
              // function writing to it).
              assert(isNullableAndMutable(parent, fieldIndex));
              evaller.addStartFixup(
                {global->name, global->type}, fieldIndex, get);
              child =
                Builder(*getModule()).makeRefNull(get->type.getHeapType());
              return true;
            }
          }

          return false;
        }